

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menuinput.cpp
# Opt level: O2

bool __thiscall DTextEnterMenu::MouseEvent(DTextEnterMenu *this,int type,int x,int y)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  FSoundID local_24;
  
  iVar4 = CleanYfac * -0x3c + (screen->super_DSimpleCanvas).super_DCanvas.Height;
  iVar2 = ((screen->super_DSimpleCanvas).super_DCanvas.Width + CleanXfac * -0xea) / 2;
  if ((y < iVar4 || x < iVar2) || iVar2 + CleanXfac * 0xea <= x) {
    this->InputGridX = -1;
    this->InputGridY = -1;
  }
  else {
    iVar3 = CleanYfac * 0xc;
    this->InputGridX = (x - iVar2) / (CleanXfac * 0x12);
    this->InputGridY = (y - iVar4) / iVar3;
    if (type == 2) {
      iVar2 = (*(this->super_DMenu).super_DObject._vptr_DObject[8])(this,6,1);
      if ((char)iVar2 != '\0') {
        S_FindSound("menu/choose");
        S_Sound(0x22,&local_24,snd_menuvolume.Value,0.0);
        if (m_use_mouse.Value == 2) {
          this->InputGridX = -1;
          this->InputGridY = -1;
        }
        return true;
      }
    }
  }
  bVar1 = DMenu::MouseEvent(&this->super_DMenu,type,x,y);
  return bVar1;
}

Assistant:

bool DTextEnterMenu::MouseEvent(int type, int x, int y)
{
	const int cell_width = 18 * CleanXfac;
	const int cell_height = 12 * CleanYfac;
	const int screen_y = screen->GetHeight() - INPUTGRID_HEIGHT * cell_height;
	const int screen_x = (screen->GetWidth() - INPUTGRID_WIDTH * cell_width) / 2;

	if (x >= screen_x && x < screen_x + INPUTGRID_WIDTH * cell_width && y >= screen_y)
	{
		InputGridX = (x - screen_x) / cell_width;
		InputGridY = (y - screen_y) / cell_height;
		if (type == DMenu::MOUSE_Release)
		{
			if (MenuEvent(MKEY_Enter, true))
			{
				S_Sound (CHAN_VOICE | CHAN_UI, "menu/choose", snd_menuvolume, ATTN_NONE);
				if (m_use_mouse == 2) InputGridX = InputGridY = -1;
				return true;
			}
		}
	}
	else
	{
		InputGridX = InputGridY = -1;
	}
	return Super::MouseEvent(type, x, y);
}